

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdantzigpr.hpp
# Opt level: O1

SPxId __thiscall
soplex::
SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterX(SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  DataKey *pDVar6;
  SPxId enterId;
  SPxId enterIdCo;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  DataKey local_128;
  DataKey local_120;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_118;
  cpp_dec_float<50U,_int,_void> local_d8;
  cpp_dec_float<50U,_int,_void> local_98;
  cpp_dec_float<50U,_int,_void> local_58;
  
  local_128.info = 0;
  local_128.idx = -1;
  local_120.info = 0;
  local_120.idx = -1;
  local_118.m_backend.data._M_elems[0] =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.data._M_elems[0];
  local_d8.data._M_elems[9] =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.data._M_elems[9];
  uVar1 = *(undefined8 *)
           ((this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thetolerance.m_backend.data._M_elems + 5);
  uVar2 = *(undefined8 *)
           ((this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thetolerance.m_backend.data._M_elems + 7);
  local_d8.data._M_elems[5] = (uint)uVar1;
  local_d8.data._M_elems[6] = (uint)((ulong)uVar1 >> 0x20);
  local_d8.data._M_elems[7] = (uint)uVar2;
  local_d8.data._M_elems[8] = (uint)((ulong)uVar2 >> 0x20);
  uVar1 = *(undefined8 *)
           ((this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thetolerance.m_backend.data._M_elems + 1);
  uVar2 = *(undefined8 *)
           ((this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thetolerance.m_backend.data._M_elems + 3);
  local_d8.data._M_elems[1] = (uint)uVar1;
  local_d8.data._M_elems[2] = (uint)((ulong)uVar1 >> 0x20);
  local_d8.data._M_elems[3] = (uint)uVar2;
  local_d8.data._M_elems[4] = (uint)((ulong)uVar2 >> 0x20);
  local_118.m_backend.exp =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.exp;
  local_118.m_backend.neg =
       (bool)((local_118.m_backend.data._M_elems[0] != 0 ||
              (this->
              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thetolerance.m_backend.fpclass != cpp_dec_float_finite) ^
             (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thetolerance.m_backend.neg);
  local_118.m_backend.fpclass =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.fpclass;
  local_118.m_backend.prec_elem =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.prec_elem;
  local_d8.fpclass =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.fpclass;
  local_d8.prec_elem =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.prec_elem;
  uVar1 = *(undefined8 *)
           ((this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thetolerance.m_backend.data._M_elems + 1);
  uVar2 = *(undefined8 *)
           ((this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thetolerance.m_backend.data._M_elems + 3);
  uVar3 = *(undefined8 *)
           ((this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thetolerance.m_backend.data._M_elems + 5);
  uVar4 = *(undefined8 *)
           ((this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thetolerance.m_backend.data._M_elems + 7);
  local_118.m_backend.data._M_elems[1] = (uint)uVar1;
  local_118.m_backend.data._M_elems[2] = (uint)((ulong)uVar1 >> 0x20);
  local_118.m_backend.data._M_elems[3] = (uint)uVar2;
  local_118.m_backend.data._M_elems[4] = (uint)((ulong)uVar2 >> 0x20);
  local_118.m_backend.data._M_elems[5] = (uint)uVar3;
  local_118.m_backend.data._M_elems[6] = (uint)((ulong)uVar3 >> 0x20);
  local_118.m_backend.data._M_elems[7] = (uint)uVar4;
  local_118.m_backend.data._M_elems[8] = (uint)((ulong)uVar4 >> 0x20);
  local_118.m_backend.data._M_elems[9] =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.data._M_elems[9];
  local_d8.data._M_elems[0] = local_118.m_backend.data._M_elems[0];
  local_d8.exp = local_118.m_backend.exp;
  local_d8.neg = local_118.m_backend.neg;
  if (((this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thesolver)->sparsePricingEnter == true) {
    local_128 = (DataKey)selectEnterSparseDim
                                   (this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_d8,(SPxId *)&local_128);
  }
  else {
    local_128 = (DataKey)selectEnterDenseDim(this,(
                                                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)&local_d8,(SPxId *)&local_128);
  }
  if (((this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thesolver)->sparsePricingEnterCo == true) {
    local_120 = (DataKey)selectEnterSparseCoDim(this,&local_118,(SPxId *)&local_128);
  }
  else {
    local_120 = (DataKey)selectEnterDenseCoDim(this,&local_118,(SPxId *)&local_128);
  }
  if (local_128.info != 0) {
    local_98.fpclass = cpp_dec_float_finite;
    local_98.prec_elem = 10;
    local_98.data._M_elems[0] = 0;
    local_98.data._M_elems[1] = 0;
    local_98.data._M_elems[2] = 0;
    local_98.data._M_elems[3] = 0;
    local_98.data._M_elems[4] = 0;
    local_98.data._M_elems[5] = 0;
    local_98.data._M_elems._24_5_ = 0;
    local_98.data._M_elems[7]._1_3_ = 0;
    local_98.data._M_elems._32_5_ = 0;
    local_98.data._M_elems[9]._1_3_ = 0;
    local_98.exp = 0;
    local_98.neg = false;
    local_58.fpclass = cpp_dec_float_finite;
    local_58.prec_elem = 10;
    local_58.data._M_elems[0] = 0;
    local_58.data._M_elems[1] = 0;
    local_58.data._M_elems[2] = 0;
    local_58.data._M_elems[3] = 0;
    local_58.data._M_elems[4] = 0;
    local_58.data._M_elems[5] = 0;
    local_58.data._M_elems._24_5_ = 0;
    local_58.data._M_elems[7]._1_3_ = 0;
    local_58.data._M_elems._32_5_ = 0;
    local_58._37_8_ = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_58,0.8);
    local_98.data._M_elems[1] = local_118.m_backend.data._M_elems[1];
    local_98.data._M_elems[0] = local_118.m_backend.data._M_elems[0];
    local_98.data._M_elems[3] = local_118.m_backend.data._M_elems[3];
    local_98.data._M_elems[2] = local_118.m_backend.data._M_elems[2];
    local_98.data._M_elems[5] = local_118.m_backend.data._M_elems[5];
    local_98.data._M_elems[4] = local_118.m_backend.data._M_elems[4];
    local_98.data._M_elems._24_5_ =
         SUB85(CONCAT44(local_118.m_backend.data._M_elems[7],local_118.m_backend.data._M_elems[6]),0
              );
    local_98.data._M_elems[7]._1_3_ = (undefined3)(local_118.m_backend.data._M_elems[7] >> 8);
    local_98.data._M_elems._32_5_ =
         SUB85(CONCAT44(local_118.m_backend.data._M_elems[9],local_118.m_backend.data._M_elems[8]),0
              );
    local_98.data._M_elems[9]._1_3_ = (undefined3)(local_118.m_backend.data._M_elems[9] >> 8);
    local_98.exp = local_118.m_backend.exp;
    local_98.neg = local_118.m_backend.neg;
    local_98.fpclass = local_118.m_backend.fpclass;
    local_98.prec_elem = local_118.m_backend.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_98,&local_58);
    if ((((local_d8.fpclass != cpp_dec_float_NaN) && (local_98.fpclass != cpp_dec_float_NaN)) &&
        (iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_d8,&local_98), pDVar6 = &local_128, 0 < iVar5)) ||
       (pDVar6 = &local_128, local_120.info == 0)) goto LAB_002c847e;
  }
  pDVar6 = &local_120;
LAB_002c847e:
  return (SPxId)*pDVar6;
}

Assistant:

SPxId SPxDantzigPR<R>::selectEnterX()
{
   SPxId enterId;
   SPxId enterIdCo;
   R best;
   R bestCo;

   best = -this->thetolerance;
   bestCo = -this->thetolerance;
   enterId = (this->thesolver->sparsePricingEnter) ? selectEnterSparseDim(best,
             enterId) : selectEnterDenseDim(best, enterId);
   enterIdCo = (this->thesolver->sparsePricingEnterCo) ? selectEnterSparseCoDim(bestCo,
               enterId) : selectEnterDenseCoDim(bestCo, enterId);

   // prefer slack indices to reduce nonzeros in basis matrix
   if(enterId.isValid() && (best > SOPLEX_SPARSITY_TRADEOFF * bestCo || !enterIdCo.isValid()))
      return enterId;
   else
      return enterIdCo;
}